

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandIf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Abc_Ntk_t *pAVar6;
  size_t sVar7;
  If_DsdMan_t *pIVar8;
  Abc_Ntk_t *pNtk;
  code *pcVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  ulong uStack_250;
  If_Par_t Pars;
  char Buffer [100];
  char LutSize [100];
  
  pAVar6 = Abc_FrameReadNtk(pAbc);
  If_ManSetDefaultPars(&Pars);
  Pars.pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
  Extra_UtilGetoptReset();
  iVar10 = 1;
LAB_001f8bbd:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCFAGRNTXYDEWSqaflepmrsdbgxyojiktncvh");
  iVar2 = globalUtilOptind;
  switch(iVar1) {
  case 0x41:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nAreaIters = iVar1;
      goto LAB_001f8f54;
    }
    pcVar11 = "Command line switch \"-A\" should be followed by a positive integer.\n";
    break;
  case 0x42:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4c:
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x55:
  case 0x56:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x68:
  case 0x75:
  case 0x77:
    goto switchD_001f8bdd_caseD_42;
  case 0x43:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nCutsMax = iVar1;
      goto LAB_001f8f54;
    }
    pcVar11 = "Command line switch \"-C\" should be followed by a positive integer.\n";
    break;
  case 0x44:
    if (globalUtilOptind < argc) {
      dVar15 = atof(argv[globalUtilOptind]);
      Pars.DelayTarget = (float)dVar15;
      globalUtilOptind = iVar2 + 1;
      if (Pars.DelayTarget <= 0.0) goto LAB_001f90a6;
      goto LAB_001f8bbd;
    }
    pcVar11 = "Command line switch \"-D\" should be followed by a floating point number.\n";
    break;
  case 0x45:
    if (globalUtilOptind < argc) {
      dVar15 = atof(argv[globalUtilOptind]);
      Pars.Epsilon = (float)dVar15;
      globalUtilOptind = iVar2 + 1;
      if ((Pars.Epsilon < 0.0) || (1.0 < Pars.Epsilon)) goto switchD_001f8bdd_caseD_42;
      goto LAB_001f8bbd;
    }
    pcVar11 = "Command line switch \"-E\" should be followed by a floating point number.\n";
    break;
  case 0x46:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nFlowIters = iVar1;
      goto LAB_001f8f54;
    }
    pcVar11 = "Command line switch \"-F\" should be followed by a positive integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nGateSize = iVar1;
LAB_001f8e71:
      globalUtilOptind = iVar2 + 1;
      if (iVar1 < 2) goto switchD_001f8bdd_caseD_42;
      goto LAB_001f8bbd;
    }
    pcVar11 = 
    "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n";
    break;
  case 0x4b:
    if (globalUtilOptind < argc) {
      Pars.nLutSize = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if (Pars.nLutSize < 0) goto switchD_001f8bdd_caseD_42;
      Pars.pLutLib = (If_LibLut_t *)0x0;
      goto LAB_001f8bbd;
    }
    pcVar11 = "Command line switch \"-K\" should be followed by a positive integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nNonDecLimit = iVar1;
      goto LAB_001f8e71;
    }
    pcVar11 = 
    "Command line switch \"-N\" should be followed by a positive integer no less than 3.\n";
    break;
  case 0x52:
    if (argc <= globalUtilOptind) {
      pcVar11 = "Command line switch \"-R\" should be followed by a floating point number.\n";
      iVar10 = 0;
      iVar2 = 1;
      goto LAB_001f94f4;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nRelaxRatio = iVar1;
LAB_001f8f54:
    bVar14 = iVar1 < 0;
LAB_001f8f5d:
    globalUtilOptind = iVar2 + 1;
    if (bVar14) goto switchD_001f8bdd_caseD_42;
    goto LAB_001f8bbd;
  case 0x53:
    if (globalUtilOptind < argc) {
      Pars.pLutStruct = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      sVar7 = strlen(Pars.pLutStruct);
      if ((sVar7 & 0xfffffffffffffffe) == 2) goto LAB_001f8bbd;
      pcVar11 = 
      "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n"
      ;
    }
    else {
      pcVar11 = "Command line switch \"-S\" should be followed by string.\n";
    }
    break;
  case 0x54:
    if (argc <= globalUtilOptind) {
      pcVar11 = "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n";
      break;
    }
    Pars.nStructType = atoi(argv[globalUtilOptind]);
    bVar13 = (uint)Pars.nStructType < 2;
    bVar14 = Pars.nStructType == 2;
LAB_001f8e1a:
    globalUtilOptind = iVar2 + 1;
    if (!bVar13 && !bVar14) {
switchD_001f8bdd_caseD_42:
LAB_001f90a6:
      if ((Pars.DelayTarget != -1.0) || (NAN(Pars.DelayTarget))) {
        sprintf(Buffer,"%.2f",(double)Pars.DelayTarget);
      }
      else {
        builtin_strncpy(Buffer + 8,"sible",6);
        builtin_strncpy(Buffer,"best pos",8);
      }
      if (Pars.nLutSize == -1) {
        builtin_strncpy(LutSize,"library",8);
      }
      else {
        sprintf(LutSize,"%d");
      }
      iVar2 = -2;
      Abc_Print(-2,"usage: if [-KCFAGRNTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyojiktncvh]\n");
      Abc_Print(-2,"\t           performs FPGA technology mapping of the network\n");
      Abc_Print(-2,"\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n",0x21,
                LutSize);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n",
                (ulong)(uint)Pars.nCutsMax);
      Abc_Print(-2,
                "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)(uint)Pars.nFlowIters);
      Abc_Print(-2,
                "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)(uint)Pars.nAreaIters);
      Abc_Print(-2,"\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n"
                ,(ulong)(uint)Pars.nGateSize);
      Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)(uint)Pars.nRelaxRatio);
      Abc_Print(-2,"\t-N num   : the max size of non-decomposable nodes [default = unused]\n",
                (ulong)(uint)Pars.nNonDecLimit);
      Abc_Print(-2,"\t-T num   : the type of LUT structures [default = any]\n");
      Abc_Print(-2,"\t-X num   : delay of AND-gate in LUT library units [default = %d]\n",
                (ulong)(uint)Pars.nAndDelay);
      Abc_Print(-2,"\t-Y num   : area of AND-gate in LUT library units [default = %d]\n",
                (ulong)(uint)Pars.nAndArea);
      Abc_Print(-2,"\t-D float : sets the delay constraint for the mapping [default = %s]\n",Buffer)
      ;
      Abc_Print(-2,"\t-E float : sets epsilon used for tie-breaking [default = %f]\n",
                (double)Pars.Epsilon);
      Abc_Print(-2,"\t-W float : sets wire delay between adjects LUTs [default = %f]\n",
                (double)Pars.WireDelay);
      pcVar11 = "not used";
      if (Pars.pLutStruct != (char *)0x0) {
        pcVar11 = Pars.pLutStruct;
      }
      Abc_Print(-2,"\t-S str   : string representing the LUT structure [default = %s]\n",pcVar11);
      pcVar12 = "yes";
      pcVar11 = "yes";
      if (Pars.fPreprocess == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,
                "\t-q       : toggles preprocessing using several starting points [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (Pars.fArea == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (Pars.fExpRed == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-r       : enables expansion/reduction of the best cuts [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (Pars.fLatchPaths == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,
                "\t-l       : optimizes latch paths for delay, other paths for area [default = %s]\n"
                ,pcVar11);
      pcVar11 = "yes";
      if (Pars.fEdge == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-e       : uses edge-based cut selection heuristics [default = %s]\n",pcVar11)
      ;
      pcVar11 = "yes";
      if (Pars.fPower == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-p       : uses power-aware cut selection heuristics [default = %s]\n",pcVar11
               );
      pcVar11 = "yes";
      if (Pars.fCutMin == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,
                "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n"
                ,pcVar11);
      pcVar11 = "yes";
      if (Pars.fDelayOptLut == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (Pars.fBidec == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,
                "\t-d       : toggles deriving local AIGs using bi-decomposition [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (Pars.fUseBat == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-b       : toggles the use of one special feature [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (Pars.fDelayOpt == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-g       : toggles delay optimization by SOP balancing [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (Pars.fDsdBalance == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-x       : toggles delay optimization by DSD balancing [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (Pars.fUserRecLib == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-y       : toggles delay optimization with recorded library [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (Pars.fUseBuffs == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,
                "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n"
                ,pcVar11);
      pcVar11 = "yes";
      if (Pars.fEnableCheck07 == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-j       : toggles enabling additional check [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (Pars.fUseCofVars == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-i       : toggles using cofactoring variables [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (Pars.fUseDsdTune == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n"
                ,pcVar11);
      pcVar11 = "yes";
      if (Pars.fDoAverage == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,
                "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n"
                ,pcVar11);
      pcVar11 = "yes";
      if (Pars.fUseDsd == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-n       : toggles computing DSDs of the cut functions [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (Pars.fUseTtPerm == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-c       : toggles computing truth tables in a new way [default = %s]\n",
                pcVar11);
      if (Pars.fVerbose == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar12);
      pcVar11 = "\t-h       : prints the command usage\n";
LAB_001f94f4:
      Abc_Print(iVar2,pcVar11);
      return iVar10;
    }
    goto LAB_001f8bbd;
  case 0x57:
    if (globalUtilOptind < argc) {
      dVar15 = atof(argv[globalUtilOptind]);
      Pars.WireDelay = (float)dVar15;
      bVar14 = Pars.WireDelay == 0.0;
      bVar13 = 0.0 < Pars.WireDelay;
      goto LAB_001f8e1a;
    }
    pcVar11 = "Command line switch \"-W\" should be followed by a floating point number.\n";
    break;
  case 0x58:
    if (globalUtilOptind < argc) {
      Pars.nAndDelay = atoi(argv[globalUtilOptind]);
      bVar14 = Pars.nAndArea < 0;
      goto LAB_001f8f5d;
    }
    pcVar11 = "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n";
    break;
  case 0x59:
    if (globalUtilOptind < argc) {
      Pars.nAndArea = atoi(argv[globalUtilOptind]);
      bVar14 = Pars.nAndDelay < 0;
      goto LAB_001f8f5d;
    }
    pcVar11 = "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n";
    break;
  case 0x61:
    Pars.fArea = Pars.fArea ^ 1;
    goto LAB_001f8bbd;
  case 0x62:
    Pars.fUseBat = Pars.fUseBat ^ 1;
    goto LAB_001f8bbd;
  case 99:
    Pars.fUseTtPerm = Pars.fUseTtPerm ^ 1;
    goto LAB_001f8bbd;
  case 100:
    Pars.fBidec = Pars.fBidec ^ 1;
    goto LAB_001f8bbd;
  case 0x65:
    Pars.fEdge = Pars.fEdge ^ 1;
    goto LAB_001f8bbd;
  case 0x66:
    Pars.fFancy._0_1_ = (byte)Pars.fFancy ^ 1;
    goto LAB_001f8bbd;
  case 0x67:
    Pars.fDelayOpt = Pars.fDelayOpt ^ 1;
    goto LAB_001f8bbd;
  case 0x69:
    Pars.fUseCofVars = Pars.fUseCofVars ^ 1;
    goto LAB_001f8bbd;
  case 0x6a:
    Pars.fEnableCheck07 = Pars.fEnableCheck07 ^ 1;
    goto LAB_001f8bbd;
  case 0x6b:
    Pars.fUseDsdTune = Pars.fUseDsdTune ^ 1;
    goto LAB_001f8bbd;
  case 0x6c:
    Pars.fLatchPaths = Pars.fLatchPaths ^ 1;
    goto LAB_001f8bbd;
  case 0x6d:
    Pars.fCutMin = Pars.fCutMin ^ 1;
    goto LAB_001f8bbd;
  case 0x6e:
    Pars.fUseDsd = Pars.fUseDsd ^ 1;
    goto LAB_001f8bbd;
  case 0x6f:
    Pars.fUseBuffs = Pars.fUseBuffs ^ 1;
    goto LAB_001f8bbd;
  case 0x70:
    Pars.fPower = Pars.fPower ^ 1;
    goto LAB_001f8bbd;
  case 0x71:
    Pars.fPreprocess = Pars.fPreprocess ^ 1;
    goto LAB_001f8bbd;
  case 0x72:
    Pars.fExpRed = Pars.fExpRed ^ 1;
    goto LAB_001f8bbd;
  case 0x73:
    Pars.fDelayOptLut = Pars.fDelayOptLut ^ 1;
    goto LAB_001f8bbd;
  case 0x74:
    Pars.fDoAverage = Pars.fDoAverage ^ 1;
    goto LAB_001f8bbd;
  case 0x76:
    Pars.fVerbose = Pars.fVerbose ^ 1;
    goto LAB_001f8bbd;
  case 0x78:
    Pars.fDsdBalance = Pars.fDsdBalance ^ 1;
    goto LAB_001f8bbd;
  case 0x79:
    Pars.fUserRecLib = Pars.fUserRecLib ^ 1;
    goto LAB_001f8bbd;
  default:
    if (iVar1 == -1) {
      if (pAVar6 == (Abc_Ntk_t *)0x0) {
        pcVar11 = "Empty network.\n";
      }
      else {
        if (Pars.nLutSize == -1) {
          if (Pars.pLutLib == (If_LibLut_t *)0x0) {
            pcVar11 = "The LUT library is not given.\n";
            goto LAB_001f99c8;
          }
          Pars.nLutSize = (Pars.pLutLib)->LutMax;
        }
        uStack_250 = (ulong)(uint)Pars.nLutSize;
        if (Pars.nLutSize - 0x21U < 0xffffffe1) {
          pcVar11 = "Incorrect LUT size (%d).\n";
          goto LAB_001f8ffb;
        }
        if (Pars.nCutsMax - 0x1000U < 0xfffff001) {
          pcVar11 = "Incorrect number of cuts.\n";
        }
        else {
          iVar2 = Abc_NtkGetChoiceNum(pAVar6);
          if (iVar2 != 0) {
            Pars.fExpRed = 0;
          }
          if (Pars.fUseBat != 0) {
            if (Pars.nLutSize - 7U < 0xfffffffd) {
              pcVar11 = "This feature only works for {4,5,6}-LUTs.\n";
              goto LAB_001f99c8;
            }
            Pars.fCutMin = 1;
          }
          if ((int)((Pars.fUseCofVars + Pars.fEnableCheck07 + Pars.fUseDsdTune + 1) -
                   (uint)(Pars.pLutStruct == (char *)0x0)) < 2) {
            if (Pars.fEnableCheck07 != 0) {
              if (Pars.nLutSize - 8U < 0xfffffffe) {
                pcVar11 = "This feature only works for {6,7}-LUTs.\n";
                goto LAB_001f99c8;
              }
              Pars.pFuncCell = If_CutPerformCheck07;
              Pars.fCutMin = 1;
            }
            if (Pars.fUseCofVars != 0) {
              if ((Pars.nLutSize & 1U) == 0) {
                pcVar11 = "This feature only works for odd-sized LUTs.\n";
                goto LAB_001f99c8;
              }
              Pars.fCutMin = 1;
            }
            if (Pars.fUseDsdTune == 0) {
LAB_001f968e:
              if (Pars.pLutStruct == (char *)0x0) {
                if (Pars.fCutMin != 0) {
LAB_001f96f5:
                  Pars.fTruth = 1;
                  Pars.fExpRed = 0;
                }
                if (Pars.fUserRecLib != 0) {
                  Pars.fTruth = 1;
                  Pars.fUsePerm = 1;
                  Pars.fCutMin = 1;
                  Pars.fExpRed = 0;
                  Pars.pLutLib = (If_LibLut_t *)0x0;
                }
                if ((Pars.fDelayOpt != 0 || Pars.fDsdBalance != 0) || Pars.fDelayOptLut != 0) {
                  Pars.fCutMin = 1;
                  Pars.fTruth = 1;
                  Pars.fExpRed = 0;
                  Pars.fUseDsd = (int)(Pars.fDsdBalance != 0 || Pars.fDelayOptLut != 0);
                  Pars.pLutLib = (If_LibLut_t *)0x0;
                }
                if (0 < Pars.nGateSize) {
                  Pars.fTruth = 1;
                  Pars.fUsePerm = 1;
                  Pars.fCutMin = 1;
                  Pars.fExpRed = 0;
                  Pars.pLutLib = (If_LibLut_t *)0x0;
                  Pars.nLutSize = Pars.nGateSize;
                }
                if (Pars.fUseTtPerm != 0 || Pars.fUseDsd != 0) {
                  Pars.fExpRed = 0;
                  Pars.fCutMin = 1;
                  Pars.fTruth = 1;
                  if (Pars.fUseDsd != 0) {
                    uVar4 = 0;
                    if ((Pars.pLutStruct != (char *)0x0) && (uVar4 = 0, Pars.pLutStruct[2] == '\0'))
                    {
                      uVar4 = (int)*Pars.pLutStruct - 0x30;
                    }
                    pIVar8 = (If_DsdMan_t *)Abc_FrameReadManDsd();
                    iVar2 = Pars.nLutSize;
                    if ((Pars.pLutStruct != (char *)0x0) && (Pars.pLutStruct[2] != '\0')) {
                      pcVar11 = "DSD only works for LUT structures XY.";
                      goto LAB_001f9911;
                    }
                    if (pIVar8 == (If_DsdMan_t *)0x0) {
                      if ((0xc < (int)uVar4) || (0xc < Pars.nLutSize)) {
                        printf("Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n"
                               ,(ulong)uVar4,0xc);
                        return 0;
                      }
                      pIVar8 = If_DsdManAlloc(Pars.nLutSize,uVar4);
                      Abc_FrameSetManDsd(pIVar8);
                    }
                    else {
                      iVar1 = If_DsdManVarNum(pIVar8);
                      if (iVar1 < iVar2) {
                        pcVar11 = "DSD manager has incompatible number of variables.";
                        goto LAB_001f9911;
                      }
                      uVar5 = If_DsdManLutSize(pIVar8);
                      if ((uVar4 != uVar5) && (Pars.fDsdBalance == 0)) {
                        pcVar11 = "DSD manager has different LUT size.";
                        goto LAB_001f9911;
                      }
                    }
                  }
                }
                iVar2 = Pars.nLutSize;
                if (Pars.fUserRecLib != 0) {
                  iVar2 = Abc_NtkRecIsRunning3();
                  if (iVar2 == 0) {
                    pcVar11 = "LMS manager is not running (use \"rec_start3\").";
LAB_001f9911:
                    puts(pcVar11);
                    return 0;
                  }
                  iVar2 = Abc_NtkRecInputNum3();
                  if (iVar2 != Pars.nLutSize) {
                    uVar4 = Abc_NtkRecInputNum3();
                    printf("The number of library inputs (%d) different from the K parameters (%d).\n"
                           ,(ulong)uVar4,(ulong)(uint)Pars.nLutSize);
                    return 0;
                  }
                }
                if ((Pars.fTruth != 0) && (0xf < iVar2)) {
                  pcVar11 = "Truth tables cannot be computed for LUT larger than %d inputs.\n";
                  uStack_250 = 0xf;
LAB_001f8ffb:
                  Abc_Print(-1,pcVar11,uStack_250);
                  return 1;
                }
                if (pAVar6->ntkType == ABC_NTK_STRASH) {
                  pAVar6 = Abc_NtkIf(pAVar6,&Pars);
joined_r0x001f9996:
                  if (pAVar6 != (Abc_Ntk_t *)0x0) {
                    Abc_FrameReplaceCurrentNetwork(pAbc,pAVar6);
                    return 0;
                  }
                  pcVar11 = "FPGA mapping has failed.\n";
                  iVar10 = 0;
                }
                else {
                  pAVar6 = Abc_NtkStrash(pAVar6,0,0,0);
                  if (pAVar6 == (Abc_Ntk_t *)0x0) {
                    pcVar11 = "Strashing before FPGA mapping has failed.\n";
                  }
                  else {
                    iVar10 = 1;
                    pNtk = Abc_NtkBalance(pAVar6,0,0,1);
                    Abc_NtkDelete(pAVar6);
                    if (pNtk != (Abc_Ntk_t *)0x0) {
                      pcVar11 = Abc_FrameReadFlag("silentmode");
                      if (pcVar11 == (char *)0x0) {
                        Abc_Print(1,"The network was strashed and balanced before FPGA mapping.\n");
                      }
                      pAVar6 = Abc_NtkIf(pNtk,&Pars);
                      Abc_NtkDelete(pNtk);
                      goto joined_r0x001f9996;
                    }
                    pcVar11 = "Balancing before FPGA mapping has failed.\n";
                  }
                }
              }
              else if (Pars.fDsdBalance == 0) {
                if (0xfffffff4 < Pars.nLutSize - 0x11U) {
                  if (Pars.fDelayOptLut == 0) {
                    pcVar9 = If_CutPerformCheck16;
                  }
                  else {
                    pcVar9 = (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0;
                  }
                  Pars.fCutMin = 1;
                  Pars.pFuncCell = pcVar9;
                  goto LAB_001f96f5;
                }
                pcVar11 = "This feature only works for [6;16]-LUTs.\n";
              }
              else {
                pcVar11 = "Incompatible options (-S and -x).\n";
              }
            }
            else {
              pIVar8 = (If_DsdMan_t *)Abc_FrameReadManDsd();
              iVar2 = Pars.nLutSize;
              if (pIVar8 == (If_DsdMan_t *)0x0) {
                pcVar11 = "DSD manager is not available.\n";
              }
              else {
                iVar3 = If_DsdManVarNum(pIVar8);
                iVar1 = Pars.nLutSize;
                if (iVar3 < iVar2) {
                  uVar4 = If_DsdManVarNum(pIVar8);
                  Abc_Print(-1,
                            "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n"
                            ,(ulong)(uint)iVar1,(ulong)uVar4);
                  return 1;
                }
                if ((Pars.fDeriveLuts == 0) ||
                   (pcVar11 = If_DsdManGetCellStr(pIVar8), pcVar11 != (char *)0x0)) {
                  Pars.fCutMin = 1;
                  Pars.fUseDsd = Pars.fCutMin;
                  If_DsdManSetNewAsUseless(pIVar8);
                  goto LAB_001f968e;
                }
                pcVar11 = "DSD manager is not matched with any particular cell.\n";
              }
            }
          }
          else {
            pcVar11 = "Only one additional check can be performed at the same time.\n";
          }
        }
      }
LAB_001f99c8:
      iVar2 = -1;
      goto LAB_001f94f4;
    }
    goto switchD_001f8bdd_caseD_42;
  }
  Abc_Print(-1,pcVar11);
  goto switchD_001f8bdd_caseD_42;
}

Assistant:

int Abc_CommandIf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    char Buffer[100], LutSize[100];
    Abc_Ntk_t * pNtk, * pNtkRes;
    If_Par_t Pars, * pPars = &Pars;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);
    If_ManSetDefaultPars( pPars );
    pPars->pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFAGRNTXYDEWSqaflepmrsdbgxyojiktncvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            // if the LUT size is specified, disable library
            pPars->pLutLib = NULL;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutsMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nFlowIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFlowIters < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nAreaIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaIters < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n" );
                goto usage;
            }
            pPars->nGateSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGateSize < 2 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer no less than 3.\n" );
                goto usage;
            }
            pPars->nNonDecLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNonDecLimit < 2 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nStructType = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStructType < 0 || pPars->nStructType > 2 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndDelay = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndArea < 0 )
                goto usage;
            break;
        case 'Y':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndArea = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndDelay < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->Epsilon = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Epsilon < 0.0 || pPars->Epsilon > 1.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->WireDelay = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->WireDelay < 0.0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pLutStruct = argv[globalUtilOptind];
            globalUtilOptind++;
            if ( strlen(pPars->pLutStruct) != 2 && strlen(pPars->pLutStruct) != 3 )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n" );
                goto usage;
            }
            break;
        case 'q':
            pPars->fPreprocess ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'r':
            pPars->fExpRed ^= 1;
            break;
        case 'f':
            pPars->fFancy ^= 1;
            break;
        case 'l':
            pPars->fLatchPaths ^= 1;
            break;
        case 'e':
            pPars->fEdge ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 's':
            pPars->fDelayOptLut ^= 1;
            break;
        case 'd':
            pPars->fBidec ^= 1;
            break;
        case 'b':
            pPars->fUseBat ^= 1;
            break;
        case 'g':
            pPars->fDelayOpt ^= 1;
            break;
        case 'x':
            pPars->fDsdBalance ^= 1;
            break;
        case 'y':
            pPars->fUserRecLib ^= 1;
            break;
        case 'o':
            pPars->fUseBuffs ^= 1;
            break;
        case 'j':
            pPars->fEnableCheck07 ^= 1;
            break;
        case 'i':
            pPars->fUseCofVars ^= 1;
            break;
        case 'k':
            pPars->fUseDsdTune ^= 1;
            break;
        case 't':
            pPars->fDoAverage ^= 1;
            break;
        case 'n':
            pPars->fUseDsd ^= 1;
            break;
        case 'c':
            pPars->fUseTtPerm ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( pPars->nLutSize == -1 )
    {
        if ( pPars->pLutLib == NULL )
        {
            Abc_Print( -1, "The LUT library is not given.\n" );
            return 1;
        }
        pPars->nLutSize = pPars->pLutLib->LutMax;
    }

    if ( pPars->nLutSize < 2 || pPars->nLutSize > IF_MAX_LUTSIZE )
    {
        Abc_Print( -1, "Incorrect LUT size (%d).\n", pPars->nLutSize );
        return 1;
    }

    if ( pPars->nCutsMax < 1 || pPars->nCutsMax >= (1<<12) )
    {
        Abc_Print( -1, "Incorrect number of cuts.\n" );
        return 1;
    }

    // enable truth table computation if choices are selected
    if ( (c = Abc_NtkGetChoiceNum( pNtk )) )
    {
//        if ( !Abc_FrameReadFlag("silentmode") )
//            Abc_Print( 0, "Performing LUT mapping with %d choices.\n", c );
        pPars->fExpRed = 0;
    }

    if ( pPars->fUseBat )
    {
        if ( pPars->nLutSize < 4 || pPars->nLutSize > 6 )
        {
            Abc_Print( -1, "This feature only works for {4,5,6}-LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }

    if ( pPars->fEnableCheck07 + pPars->fUseCofVars + pPars->fUseDsdTune + (pPars->pLutStruct != NULL) > 1 )
    {
        Abc_Print( -1, "Only one additional check can be performed at the same time.\n" );
        return 1;
    }
    if ( pPars->fEnableCheck07 )
    {
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 7 )
        {
            Abc_Print( -1, "This feature only works for {6,7}-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = If_CutPerformCheck07;
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseCofVars )
    {
        if ( !(pPars->nLutSize & 1) )
        {
            Abc_Print( -1, "This feature only works for odd-sized LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseDsdTune )
    {
        If_DsdMan_t * pDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pDsdMan == NULL )
        {
            Abc_Print( -1, "DSD manager is not available.\n" );
            return 1;
        }
        if ( pPars->nLutSize > If_DsdManVarNum(pDsdMan) )
        {
            Abc_Print( -1, "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n", pPars->nLutSize, If_DsdManVarNum(pDsdMan) );
            return 1;
        }
        if ( pPars->fDeriveLuts && If_DsdManGetCellStr(pDsdMan) == NULL )
        {
            Abc_Print( -1, "DSD manager is not matched with any particular cell.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
        pPars->fUseDsd = 1;
        If_DsdManSetNewAsUseless( pDsdMan );
    }
    if ( pPars->pLutStruct )
    {
        if ( pPars->fDsdBalance )
        {
            Abc_Print( -1, "Incompatible options (-S and -x).\n" );
            return 1;
        }
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 16 )
        {
            Abc_Print( -1, "This feature only works for [6;16]-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = pPars->fDelayOptLut ? NULL : If_CutPerformCheck16;
        pPars->fCutMin = 1;
    }

    // enable truth table computation if cut minimization is selected
    if ( pPars->fCutMin )
    {
        pPars->fTruth = 1;
        pPars->fExpRed = 0;
    }
    // modify the subgraph recording
    if ( pPars->fUserRecLib )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->fDelayOpt || pPars->fDsdBalance || pPars->fDelayOptLut )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUseDsd     =  pPars->fDsdBalance || pPars->fDelayOptLut;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->nGateSize > 0 )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
        pPars->nLutSize    =  pPars->nGateSize;
    }

    if ( pPars->fUseDsd || pPars->fUseTtPerm )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
    }

    if ( pPars->fUseDsd )
    {
        int LutSize = (pPars->pLutStruct && pPars->pLutStruct[2] == 0)? pPars->pLutStruct[0] - '0' : 0;
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->pLutStruct && pPars->pLutStruct[2] != 0 )
        {
            printf( "DSD only works for LUT structures XY.\n" );
            return 0;
        }
        if ( p && pPars->nLutSize > If_DsdManVarNum(p) )
        {
            printf( "DSD manager has incompatible number of variables.\n" );
            return 0;
        }
        if ( p && LutSize != If_DsdManLutSize(p) && !pPars->fDsdBalance )
        {
            printf( "DSD manager has different LUT size.\n" );
            return 0;
        }
        if ( p == NULL )
        {
            if ( LutSize > DAU_MAX_VAR || pPars->nLutSize > DAU_MAX_VAR )
            {
                printf( "Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n", LutSize, DAU_MAX_VAR );
                return 0;
            }
            Abc_FrameSetManDsd( If_DsdManAlloc(pPars->nLutSize, LutSize) );
        }
    }

    if ( pPars->fUserRecLib )
    {
        if ( !Abc_NtkRecIsRunning3() )
        {
            printf( "LMS manager is not running (use \"rec_start3\").\n" );
            return 0;
        }
        if ( Abc_NtkRecInputNum3() != pPars->nLutSize )
        {
            printf( "The number of library inputs (%d) different from the K parameters (%d).\n", Abc_NtkRecInputNum3(), pPars->nLutSize );
            return 0;
        }
    }
 
    // complain if truth tables are requested but the cut size is too large
    if ( pPars->fTruth && pPars->nLutSize > IF_MAX_FUNC_LUTSIZE )
    {
        Abc_Print( -1, "Truth tables cannot be computed for LUT larger than %d inputs.\n", IF_MAX_FUNC_LUTSIZE );
        return 1;
    }

    // disable cut-expansion if edge-based heuristics are selected
//    if ( pPars->fEdge )
//        pPars->fExpRed = 0;

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        // strash and balance the network
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Strashing before FPGA mapping has failed.\n" );
            return 1;
        }
        pNtk = Abc_NtkBalance( pNtkRes = pNtk, 0, 0, 1 );
        Abc_NtkDelete( pNtkRes );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Balancing before FPGA mapping has failed.\n" );
            return 1;
        }
        if ( !Abc_FrameReadFlag("silentmode") )
            Abc_Print( 1, "The network was strashed and balanced before FPGA mapping.\n" );
        // get the new network
        pNtkRes = Abc_NtkIf( pNtk, pPars );
        if ( pNtkRes == NULL )
        {
            Abc_NtkDelete( pNtk );
            Abc_Print( -1, "FPGA mapping has failed.\n" );
            return 0;
        }
        Abc_NtkDelete( pNtk );
    }
    else
    {
        // get the new network
        pNtkRes = Abc_NtkIf( pNtk, pPars );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "FPGA mapping has failed.\n" );
            return 0;
        }
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%.2f", pPars->DelayTarget );
    if ( pPars->nLutSize == -1 )
        sprintf(LutSize, "library" );
    else
        sprintf(LutSize, "%d", pPars->nLutSize );
    Abc_Print( -2, "usage: if [-KCFAGRNTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyojiktncvh]\n" );
    Abc_Print( -2, "\t           performs FPGA technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n", IF_MAX_LUTSIZE+1, LutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n", pPars->nCutsMax );
    Abc_Print( -2, "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n", pPars->nFlowIters );
    Abc_Print( -2, "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n", pPars->nAreaIters );
    Abc_Print( -2, "\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n", pPars->nGateSize );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-N num   : the max size of non-decomposable nodes [default = unused]\n", pPars->nNonDecLimit );
    Abc_Print( -2, "\t-T num   : the type of LUT structures [default = any]\n" );
    Abc_Print( -2, "\t-X num   : delay of AND-gate in LUT library units [default = %d]\n", pPars->nAndDelay );
    Abc_Print( -2, "\t-Y num   : area of AND-gate in LUT library units [default = %d]\n", pPars->nAndArea );
    Abc_Print( -2, "\t-D float : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-E float : sets epsilon used for tie-breaking [default = %f]\n", pPars->Epsilon );
    Abc_Print( -2, "\t-W float : sets wire delay between adjects LUTs [default = %f]\n", pPars->WireDelay );
    Abc_Print( -2, "\t-S str   : string representing the LUT structure [default = %s]\n", pPars->pLutStruct ? pPars->pLutStruct : "not used" );
    Abc_Print( -2, "\t-q       : toggles preprocessing using several starting points [default = %s]\n", pPars->fPreprocess? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fArea? "yes": "no" );
    Abc_Print( -2, "\t-r       : enables expansion/reduction of the best cuts [default = %s]\n", pPars->fExpRed? "yes": "no" );
    Abc_Print( -2, "\t-l       : optimizes latch paths for delay, other paths for area [default = %s]\n", pPars->fLatchPaths? "yes": "no" );
    Abc_Print( -2, "\t-e       : uses edge-based cut selection heuristics [default = %s]\n", pPars->fEdge? "yes": "no" );
    Abc_Print( -2, "\t-p       : uses power-aware cut selection heuristics [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n", pPars->fDelayOptLut? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles deriving local AIGs using bi-decomposition [default = %s]\n", pPars->fBidec? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggles the use of one special feature [default = %s]\n", pPars->fUseBat? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles delay optimization by SOP balancing [default = %s]\n", pPars->fDelayOpt? "yes": "no" );
    Abc_Print( -2, "\t-x       : toggles delay optimization by DSD balancing [default = %s]\n", pPars->fDsdBalance? "yes": "no" );
    Abc_Print( -2, "\t-y       : toggles delay optimization with recorded library [default = %s]\n", pPars->fUserRecLib? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n", pPars->fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-j       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck07? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggles using cofactoring variables [default = %s]\n", pPars->fUseCofVars? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n", pPars->fUseDsdTune? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n", pPars->fDoAverage? "yes": "no" );
    Abc_Print( -2, "\t-n       : toggles computing DSDs of the cut functions [default = %s]\n", pPars->fUseDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles computing truth tables in a new way [default = %s]\n", pPars->fUseTtPerm? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}